

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall
pbrt::CoatedConductorMaterial::ToString_abi_cxx11_(CoatedConductorMaterial *this)

{
  string *in_RDI;
  
  StringPrintf<>((char *)this);
  return in_RDI;
}

Assistant:

std::string CoatedConductorMaterial::ToString() const {
    return StringPrintf("[ CoatedConductorMaterial TODO ]");
}